

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O2

void __thiscall xray_re::cse_smart_cover::cse_smart_cover(cse_smart_cover *this)

{
  allocator<char> local_19;
  
  (this->super_cse_shape)._vptr_cse_shape = (_func_int **)&PTR__cse_shape_00235938;
  (this->super_cse_shape).m_shapes.
  super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_cse_shape).m_shapes.
  super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_cse_shape).m_shapes.
  super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cse_alife_dynamic_object::cse_alife_dynamic_object(&this->super_cse_alife_dynamic_object);
  (this->super_cse_shape)._vptr_cse_shape = (_func_int **)&PTR__cse_smart_cover_00235b98;
  (this->super_cse_alife_dynamic_object).super_cse_alife_object.super_cse_abstract.
  _vptr_cse_abstract = (_func_int **)&PTR__cse_smart_cover_00235be0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_cs_unk1_sz,"",&local_19);
  this->m_cs_unk2_float = 0.0;
  this->m_enter_min_enemy_distance = 15.0;
  this->m_exit_min_enemy_distance = 10.0;
  this->m_is_combat_cover = true;
  this->m_cs_unk3_u8 = '\0';
  return;
}

Assistant:

cse_smart_cover::cse_smart_cover():
	m_cs_unk1_sz(""), m_cs_unk2_float(0.f),
	m_enter_min_enemy_distance(15.f), m_exit_min_enemy_distance(10.f),
	m_is_combat_cover(true), m_cs_unk3_u8(0) {}